

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O0

void BrotliOptimizeHistograms(uint32_t num_distance_codes,MetaBlockSplit *mb)

{
  ulong local_2e0;
  size_t i;
  uint8_t good_for_rle [704];
  MetaBlockSplit *mb_local;
  uint32_t num_distance_codes_local;
  
  good_for_rle._696_8_ = mb;
  for (local_2e0 = 0; local_2e0 < *(ulong *)(good_for_rle._696_8_ + 0xb8); local_2e0 = local_2e0 + 1
      ) {
    BrotliOptimizeHuffmanCountsForRle
              (0x100,(uint32_t *)(*(long *)(good_for_rle._696_8_ + 0xb0) + local_2e0 * 0x410),
               (uint8_t *)&i);
  }
  for (local_2e0 = 0; local_2e0 < *(ulong *)(good_for_rle._696_8_ + 200); local_2e0 = local_2e0 + 1)
  {
    BrotliOptimizeHuffmanCountsForRle
              (0x2c0,(uint32_t *)(*(long *)(good_for_rle._696_8_ + 0xc0) + local_2e0 * 0xb10),
               (uint8_t *)&i);
  }
  for (local_2e0 = 0; local_2e0 < *(ulong *)(good_for_rle._696_8_ + 0xd8); local_2e0 = local_2e0 + 1
      ) {
    BrotliOptimizeHuffmanCountsForRle
              ((ulong)num_distance_codes,
               (uint32_t *)(*(long *)(good_for_rle._696_8_ + 0xd0) + local_2e0 * 0x890),
               (uint8_t *)&i);
  }
  return;
}

Assistant:

void BrotliOptimizeHistograms(uint32_t num_distance_codes,
                              MetaBlockSplit* mb) {
  uint8_t good_for_rle[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t i;
  for (i = 0; i < mb->literal_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(256, mb->literal_histograms[i].data_,
                                      good_for_rle);
  }
  for (i = 0; i < mb->command_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(BROTLI_NUM_COMMAND_SYMBOLS,
                                      mb->command_histograms[i].data_,
                                      good_for_rle);
  }
  for (i = 0; i < mb->distance_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(num_distance_codes,
                                      mb->distance_histograms[i].data_,
                                      good_for_rle);
  }
}